

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByPrintableName
          (DescriptorPool *this,Descriptor *extendee,ConstStringParam printable_name)

{
  long lVar1;
  once_flag *__once;
  FieldDescriptor *pFVar2;
  Descriptor *pDVar3;
  Descriptor *pDVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  FieldDescriptor *local_48;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  if (*(int *)(extendee + 0x78) == 0) {
    return (FieldDescriptor *)0x0;
  }
  pFVar2 = FindExtensionByName(this,printable_name);
  if ((pFVar2 == (FieldDescriptor *)0x0) || (*(Descriptor **)(pFVar2 + 0x20) != extendee)) {
    if (*(char *)(*(long *)(extendee + 0x20) + 0x48) == '\x01') {
      pDVar3 = FindMessageTypeByName(this,printable_name);
      if (pDVar3 == (Descriptor *)0x0) {
        bVar8 = true;
      }
      else {
        uVar5 = (ulong)*(int *)(pDVar3 + 0x7c);
        bVar8 = (long)uVar5 < 1;
        if (0 < (long)uVar5) {
          lVar6 = 0x20;
          uVar7 = 1;
          do {
            lVar1 = *(long *)(pDVar3 + 0x50);
            if (*(Descriptor **)(lVar1 + lVar6) == extendee) {
              pFVar2 = (FieldDescriptor *)(lVar1 + lVar6 + -0x20);
              __once = *(once_flag **)(lVar1 + lVar6 + -8);
              if (__once != (once_flag *)0x0) {
                local_38 = FieldDescriptor::TypeOnceInit;
                local_40 = pFVar2;
                std::
                call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                          (__once,&local_38,&local_40);
              }
              if (((*(char *)(lVar1 + -0x1e + lVar6) != '\v') ||
                  ((*(byte *)(lVar1 + -0x1f + lVar6) & 0x60) != 0x20)) ||
                 (pDVar4 = FieldDescriptor::message_type(pFVar2), pDVar4 != pDVar3))
              goto LAB_0034d172;
              bVar9 = false;
              local_48 = pFVar2;
            }
            else {
LAB_0034d172:
              bVar9 = true;
            }
            if (!bVar9) break;
            bVar8 = uVar5 <= uVar7;
            lVar6 = lVar6 + 0x48;
            bVar9 = uVar7 != uVar5;
            uVar7 = uVar7 + 1;
          } while (bVar9);
        }
      }
      if (!bVar8) {
        return local_48;
      }
    }
    pFVar2 = (FieldDescriptor *)0x0;
  }
  return pFVar2;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByPrintableName(
    const Descriptor* extendee, ConstStringParam printable_name) const {
  if (extendee->extension_range_count() == 0) return nullptr;
  const FieldDescriptor* result = FindExtensionByName(printable_name);
  if (result != nullptr && result->containing_type() == extendee) {
    return result;
  }
  if (extendee->options().message_set_wire_format()) {
    // MessageSet extensions may be identified by type name.
    const Descriptor* type = FindMessageTypeByName(printable_name);
    if (type != nullptr) {
      // Look for a matching extension in the foreign type's scope.
      const int type_extension_count = type->extension_count();
      for (int i = 0; i < type_extension_count; i++) {
        const FieldDescriptor* extension = type->extension(i);
        if (extension->containing_type() == extendee &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() && extension->message_type() == type) {
          // Found it.
          return extension;
        }
      }
    }
  }
  return nullptr;
}